

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O1

void sys_expandpath(char *from,char *to,int bufsize)

{
  int iVar1;
  size_t sVar2;
  char *__src;
  char *pcVar3;
  
  sVar2 = strlen(from);
  if ((sVar2 != 1) || (*from != '~')) {
    iVar1 = strncmp(from,"~/",2);
    if (iVar1 != 0) {
      strncpy(to,from,1000);
      pcVar3 = to + 999;
      goto LAB_00177e09;
    }
  }
  __src = getenv("HOME");
  pcVar3 = to;
  if (__src != (char *)0x0) {
    strncpy(to,__src,1000);
    pcVar3 = to + 999;
    to[999] = '\0';
    sVar2 = strlen(to);
    strncpy(to + sVar2,from + 1,1000 - sVar2);
  }
LAB_00177e09:
  *pcVar3 = '\0';
  return;
}

Assistant:

static void sys_expandpath(const char *from, char *to, int bufsize)
{
    if ((strlen(from) == 1 && from[0] == '~') || (strncmp(from,"~/", 2) == 0))
    {
#ifdef _WIN32
        const char *home = getenv("USERPROFILE");
#else
        const char *home = getenv("HOME");
#endif
        if (home)
        {
            strncpy(to, home, bufsize);
            to[bufsize-1] = 0;
            strncpy(to + strlen(to), from + 1, bufsize - strlen(to));
            to[bufsize-1] = 0;
        }
        else *to = 0;
    }
    else
    {
        strncpy(to, from, bufsize);
        to[bufsize-1] = 0;
    }
#ifdef _WIN32
    {
        char *buf = alloca(bufsize);
        ExpandEnvironmentStrings(to, buf, bufsize-1);
        buf[bufsize-1] = 0;
        strncpy(to, buf, bufsize);
        to[bufsize-1] = 0;
    }
#endif
}